

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kpagent.c
# Opt level: O0

kp_error_t kp_agent_store(kp_agent *agent,kp_unsafe *unsafe)

{
  ulong uVar1;
  int *piVar2;
  void *pvVar3;
  kp_agent *agent_00;
  kp_agent *in_RSI;
  kp_agent_safe *safe;
  kp_store *existing;
  kp_store *store;
  kp_error_t ret;
  kp_agent_safe *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  kp_error_t local_4;
  
  local_4 = kp_agent_safe_create
                      (in_RSI,(kp_agent_safe **)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (local_4 == 0) {
    uVar1 = strlcpy(in_stack_ffffffffffffffc8,&in_RSI->ibuf,0x1000);
    if (uVar1 < 0x1000) {
      uVar1 = strlcpy(in_stack_ffffffffffffffc8->password,(in_RSI->ibuf).r.buf + 0xff0,0x1000);
      if (uVar1 < 0x1000) {
        uVar1 = strlcpy(in_stack_ffffffffffffffc8->metadata,(in_RSI->ibuf).r.buf + 0x1ff0,0x1000);
        if (uVar1 < 0x1000) {
          pvVar3 = malloc(0x28);
          if (pvVar3 == (void *)0x0) {
            piVar2 = __errno_location();
            *piVar2 = 0xc;
            local_4 = 5;
          }
          else {
            *(kp_agent_safe **)((long)pvVar3 + 0x20) = in_stack_ffffffffffffffc8;
            agent_00 = (kp_agent *)
                       storage_RB_INSERT((storage *)in_RSI,
                                         (kp_store *)CONCAT44(local_4,in_stack_ffffffffffffffe0));
            if (agent_00 != (kp_agent *)0x0) {
              kp_agent_safe_free(agent_00,in_stack_ffffffffffffffc8);
              *(kp_agent_safe **)((agent_00->ibuf).r.buf + 8) = in_stack_ffffffffffffffc8;
            }
            local_4 = 0;
          }
        }
        else {
          piVar2 = __errno_location();
          *piVar2 = 0xc;
          local_4 = 5;
        }
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = 0xc;
        local_4 = 5;
      }
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      local_4 = 5;
    }
  }
  return local_4;
}

Assistant:

kp_error_t
kp_agent_store(struct kp_agent *agent, struct kp_unsafe *unsafe)
{
	kp_error_t ret;
	struct kp_store *store, *existing;
	struct kp_agent_safe *safe;

	if ((ret = kp_agent_safe_create(agent, &safe)) != KP_SUCCESS) {
		return ret;
	}

	if (strlcpy(safe->name, unsafe->name, PATH_MAX) >= PATH_MAX) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->password, unsafe->password, KP_PASSWORD_MAX_LEN)
	    >= KP_PASSWORD_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->metadata, unsafe->metadata, KP_METADATA_MAX_LEN)
	    >= KP_METADATA_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	if ((store = malloc(sizeof(struct kp_store))) == NULL) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	store->safe = safe;

	existing = RB_INSERT(storage, &storage, store);
	if (existing != NULL) {
		kp_agent_safe_free(agent, existing->safe);
		existing->safe = safe;
	}

	ret = KP_SUCCESS;

out:
	return ret;
}